

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O1

void printPath(Path *path)

{
  uint uVar1;
  TileNode *pTVar2;
  
  pTVar2 = path->first;
  puts("\n\n#### PRINTING PATH ####\n");
  if (path->count != 0) {
    uVar1 = 0;
    do {
      printf("Location: %d :",(ulong)(uint)pTVar2->location);
      printf("Type: %c\n",(ulong)(uint)(int)pTVar2->type);
      pTVar2 = pTVar2->next;
      uVar1 = uVar1 + 1;
    } while (uVar1 < path->count);
  }
  puts("\n########################");
  return;
}

Assistant:

void printPath(struct Path *path) {
    struct TileNode *nextNode;

    nextNode = path->first;
    printf("\n\n#### PRINTING PATH ####\n\n");
    for (int i = 0; i < path->count; i++) {
        printf("Location: %d :", nextNode->location);
        printf("Type: %c\n", nextNode->type);
        nextNode = nextNode->next;
    }
    printf("\n########################\n");
}